

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_inter.c
# Opt level: O0

void sys_set_priority(int mode)

{
  int iVar1;
  uint local_38;
  uint local_34;
  undefined1 local_30 [8];
  rlimit mlock_limit;
  int p3;
  int p2;
  int p1;
  sched_param par;
  int mode_local;
  
  p1 = mode;
  sched_get_priority_min(1);
  iVar1 = sched_get_priority_max(1);
  if (p1 == 2) {
    local_34 = iVar1 - 5;
  }
  else {
    if (p1 == 1) {
      local_38 = iVar1 - 7;
    }
    else {
      local_38 = 0;
    }
    local_34 = local_38;
  }
  mlock_limit.rlim_max._4_4_ = local_34;
  p2 = local_34;
  iVar1 = sched_setscheduler(0,(uint)(p1 != 0),(sched_param *)&p2);
  if (iVar1 < 0) {
    if (p1 == 2) {
      fprintf(_stderr,"priority %d scheduling failed.\n",(ulong)mlock_limit.rlim_max._4_4_);
    }
    else {
      post("priority %d scheduling failed; running at normal priority",
           (ulong)mlock_limit.rlim_max._4_4_);
    }
  }
  else if (p1 == 1) {
    logpost((void *)0x0,4,"priority %d scheduling enabled.\n",(ulong)mlock_limit.rlim_max._4_4_);
  }
  else {
    logpost((void *)0x0,4,"running at normal (non-real-time) priority.\n");
  }
  if (p1 == 0) {
    munlockall();
  }
  else {
    local_30 = (undefined1  [8])0x0;
    mlock_limit.rlim_cur = 0;
    setrlimit(__RLIMIT_MEMLOCK,(rlimit *)local_30);
    iVar1 = mlockall(2);
    if ((iVar1 != -1) && (sys_verbose != 0)) {
      fprintf(_stderr,"memory locking enabled.\n");
    }
  }
  return;
}

Assistant:

void sys_set_priority(int mode)
{
#ifdef _POSIX_PRIORITY_SCHEDULING
    struct sched_param par;
    int p1, p2, p3;
    p1 = sched_get_priority_min(SCHED_FIFO);
    p2 = sched_get_priority_max(SCHED_FIFO);
#ifdef USEAPI_JACK
    p3 = (mode == MODE_WATCHDOG ? p1 + 7 : (mode == MODE_RT ? p1 + 5 : 0));
#else
    p3 = (mode == MODE_WATCHDOG ? p2 - 5 : (mode == MODE_RT ? p2 - 7 : 0));
#endif
    par.sched_priority = p3;
    if (sched_setscheduler(0,
        (mode == MODE_NRT ? SCHED_OTHER : SCHED_FIFO), &par) < 0)
    {
        if (mode == MODE_WATCHDOG)
            fprintf(stderr, "priority %d scheduling failed.\n", p3);
        else post("priority %d scheduling failed; running at normal priority",
                p3);
    }
    else
    {
        if (mode == MODE_RT)
            logpost(NULL, PD_VERBOSE, "priority %d scheduling enabled.\n", p3);
        else logpost(NULL, PD_VERBOSE, "running at normal (non-real-time) priority.\n");
    }
#endif

#if !defined(USEAPI_JACK)
    if (mode != MODE_NRT)
    {
            /* tb: force memlock to physical memory { */
        struct rlimit mlock_limit;
        mlock_limit.rlim_cur=0;
        mlock_limit.rlim_max=0;
        setrlimit(RLIMIT_MEMLOCK,&mlock_limit);
            /* } tb */
        if (mlockall(MCL_FUTURE) != -1 && sys_verbose)
            fprintf(stderr, "memory locking enabled.\n");
    }
    else munlockall();
#endif
}